

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O1

void tcg_out_qemu_ld(TCGContext_conflict9 *s,TCGArg *args,_Bool is64)

{
  ulong uVar1;
  byte *pbVar2;
  tcg_insn_unit *ptVar3;
  byte bVar4;
  uint uVar5;
  undefined7 in_register_00000011;
  uint mem_index;
  TCGReg addrlo;
  uint opc;
  TCGReg opc_00;
  byte bVar6;
  TCGReg oi;
  uint uVar7;
  TCGReg datalo;
  int iVar8;
  uint uVar9;
  int in_stack_ffffffffffffffa8;
  TCGReg TVar10;
  int iVar11;
  TCGReg TVar12;
  tcg_insn_unit *label_ptr [2];
  
  uVar1 = *args;
  addrlo = *(TCGReg *)(args + 1);
  oi = *(TCGReg *)(args + 2);
  mem_index = oi >> 4;
  tcg_out_tlb_load(s,addrlo,oi & TCG_REG_R15,mem_index,(MemOp)label_ptr,(tcg_insn_unit **)0x0,
                   in_stack_ffffffffffffffa8);
  uVar5 = mem_index & 8;
  iVar8 = (int)CONCAT71(in_register_00000011,is64);
  uVar9 = iVar8 << 0xc;
  bVar6 = (byte)(uVar5 >> 3) & have_movbe;
  uVar7 = 0;
  if (have_movbe == false) {
    uVar7 = uVar5;
  }
  opc = 0x8b;
  if (bVar6 != 0) {
    opc = 0x2f0;
  }
  datalo = (TCGReg)uVar1;
  bVar4 = (byte)uVar1;
  TVar10 = oi;
  TVar12 = addrlo;
  switch(mem_index & 7) {
  case 0:
    if ((uVar1 & 8) != 0) {
      ptVar3 = s->code_ptr;
      s->code_ptr = ptVar3 + 1;
      *ptVar3 = 'D';
    }
    ptVar3 = s->code_ptr;
    s->code_ptr = ptVar3 + 1;
    *ptVar3 = '\x0f';
    ptVar3 = s->code_ptr;
    s->code_ptr = ptVar3 + 1;
    *ptVar3 = 0xb6;
    break;
  case 1:
    if ((uVar1 & 8) != 0) {
      ptVar3 = s->code_ptr;
      s->code_ptr = ptVar3 + 1;
      *ptVar3 = 'D';
    }
    ptVar3 = s->code_ptr;
    s->code_ptr = ptVar3 + 1;
    *ptVar3 = '\x0f';
    ptVar3 = s->code_ptr;
    s->code_ptr = ptVar3 + 1;
    *ptVar3 = 0xb7;
    pbVar2 = s->code_ptr;
    s->code_ptr = pbVar2 + 1;
    *pbVar2 = bVar4 * '\b' & 0x38 | 6;
    iVar11 = iVar8;
    if (uVar5 != 0) {
      ptVar3 = s->code_ptr;
      s->code_ptr = ptVar3 + 1;
      *ptVar3 = 'f';
      if ((uVar1 & 8) != 0) {
        ptVar3 = s->code_ptr;
        s->code_ptr = ptVar3 + 1;
        *ptVar3 = 'A';
      }
      ptVar3 = s->code_ptr;
      s->code_ptr = ptVar3 + 1;
      *ptVar3 = 0xc1;
      pbVar2 = s->code_ptr;
      s->code_ptr = pbVar2 + 1;
      *pbVar2 = bVar4 & 7 | 0xc0;
      ptVar3 = s->code_ptr;
      s->code_ptr = ptVar3 + 1;
      *ptVar3 = '\b';
    }
    goto LAB_00d110cb;
  case 2:
    tcg_out_opc(s,opc,datalo,6,0);
    pbVar2 = s->code_ptr;
    s->code_ptr = pbVar2 + 1;
    *pbVar2 = (bVar4 & 7) << 3 | 6;
    TVar10 = oi;
    iVar11 = iVar8;
    TVar12 = addrlo;
    if (uVar7 == 0) goto LAB_00d110cb;
    opc_00 = datalo & TCG_REG_EDI | 0x1c8;
    goto LAB_00d10e20;
  case 3:
    tcg_out_opc(s,opc | 0x1000,datalo,6,0);
    pbVar2 = s->code_ptr;
    s->code_ptr = pbVar2 + 1;
    *pbVar2 = (bVar4 & 7) << 3 | 6;
    TVar10 = oi;
    iVar11 = iVar8;
    TVar12 = addrlo;
    if (uVar7 == 0) goto LAB_00d110cb;
    opc_00 = datalo & TCG_REG_EDI | 0x11c8;
LAB_00d10e20:
    TVar10 = oi;
    iVar11 = iVar8;
    TVar12 = addrlo;
    tcg_out_opc(s,opc_00,0,datalo,0);
    goto LAB_00d110cb;
  case 4:
    uVar9 = uVar9 | 0x1be;
    goto LAB_00d11050;
  case 5:
    if (uVar5 != 0) {
      if (have_movbe == false) {
        if ((uVar1 & 8) != 0) {
          ptVar3 = s->code_ptr;
          s->code_ptr = ptVar3 + 1;
          *ptVar3 = 'D';
        }
        ptVar3 = s->code_ptr;
        s->code_ptr = ptVar3 + 1;
        *ptVar3 = '\x0f';
        ptVar3 = s->code_ptr;
        s->code_ptr = ptVar3 + 1;
        *ptVar3 = 0xb7;
        pbVar2 = s->code_ptr;
        s->code_ptr = pbVar2 + 1;
        *pbVar2 = bVar4 * '\b' & 0x38 | 6;
        ptVar3 = s->code_ptr;
        s->code_ptr = ptVar3 + 1;
        *ptVar3 = 'f';
        if ((uVar1 & 8) != 0) {
          ptVar3 = s->code_ptr;
          s->code_ptr = ptVar3 + 1;
          *ptVar3 = 'A';
        }
        ptVar3 = s->code_ptr;
        s->code_ptr = ptVar3 + 1;
        *ptVar3 = 0xc1;
        pbVar2 = s->code_ptr;
        s->code_ptr = pbVar2 + 1;
        *pbVar2 = bVar4 & 7 | 0xc0;
        bVar6 = 8;
      }
      else {
        tcg_out_opc(s,0x6f0,datalo,6,0);
        bVar6 = (bVar4 & 7) << 3 | 6;
      }
      pbVar2 = s->code_ptr;
      s->code_ptr = pbVar2 + 1;
      *pbVar2 = bVar6;
      tcg_out_opc(s,uVar9 | 0x1bf,datalo,datalo,0);
      pbVar2 = s->code_ptr;
      s->code_ptr = pbVar2 + 1;
      *pbVar2 = (bVar4 & 7) + bVar4 * '\b' | 0xc0;
      iVar11 = iVar8;
      goto LAB_00d110cb;
    }
    uVar9 = uVar9 | 0x1bf;
LAB_00d11050:
    tcg_out_opc(s,uVar9,datalo,6,0);
    break;
  case 6:
    if (uVar5 != 0) {
      tcg_out_opc(s,opc,datalo,6,0);
      pbVar2 = s->code_ptr;
      s->code_ptr = pbVar2 + 1;
      *pbVar2 = bVar4 * '\b' & 0x38 | 6;
      iVar11 = iVar8;
      if (bVar6 == 0) {
        tcg_out_opc(s,datalo & TCG_REG_EDI | 0x1c8,0,datalo,0);
      }
      pbVar2 = s->code_ptr;
      s->code_ptr = pbVar2 + 1;
      *pbVar2 = (byte)(uVar1 >> 3) & 1 | (byte)(uVar1 >> 1) & 4 | 0x48;
      ptVar3 = s->code_ptr;
      s->code_ptr = ptVar3 + 1;
      *ptVar3 = 'c';
      pbVar2 = s->code_ptr;
      s->code_ptr = pbVar2 + 1;
      *pbVar2 = bVar4 & 7 | bVar4 * '\b' | 0xc0;
      TVar10 = oi;
      TVar12 = addrlo;
      goto LAB_00d110cb;
    }
    pbVar2 = s->code_ptr;
    s->code_ptr = pbVar2 + 1;
    *pbVar2 = (byte)((uVar1 & 0xffffffff) >> 1) & 4 | 0x48;
    ptVar3 = s->code_ptr;
    s->code_ptr = ptVar3 + 1;
    *ptVar3 = 'c';
    break;
  case 7:
    tcg_out_qemu_ld_cold_1();
  }
  pbVar2 = s->code_ptr;
  s->code_ptr = pbVar2 + 1;
  *pbVar2 = (bVar4 & 7) << 3 | 6;
  TVar10 = oi;
  iVar11 = iVar8;
  TVar12 = addrlo;
LAB_00d110cb:
  add_qemu_ldst_label(s,true,SUB41(iVar8,0),oi,datalo,addrlo,(TCGReg)s->code_ptr,(TCGReg)label_ptr,
                      (tcg_insn_unit *)CONCAT44(TVar10,in_stack_ffffffffffffffa8),
                      (tcg_insn_unit **)CONCAT44(TVar12,iVar11));
  return;
}

Assistant:

static void tcg_out_qemu_ld(TCGContext *s, const TCGArg *args, bool is64)
{
    TCGReg datalo, datahi, addrlo;
    TCGReg addrhi QEMU_UNUSED_VAR;
    TCGMemOpIdx oi;
    MemOp opc;
    int mem_index;
    tcg_insn_unit *label_ptr[2];

    datalo = *args++;
    datahi = (TCG_TARGET_REG_BITS == 32 && is64 ? *args++ : 0);
    addrlo = *args++;
    addrhi = (TARGET_LONG_BITS > TCG_TARGET_REG_BITS ? *args++ : 0);
    oi = *args++;
    opc = get_memop(oi);

    mem_index = get_mmuidx(oi);

    tcg_out_tlb_load(s, addrlo, addrhi, mem_index, opc,
                     label_ptr, offsetof(CPUTLBEntry, addr_read));

    /* TLB Hit.  */
    tcg_out_qemu_ld_direct(s, datalo, datahi, TCG_REG_L1, -1, 0, 0, is64, opc);

    /* Record the current context of a load into ldst label */
    add_qemu_ldst_label(s, true, is64, oi, datalo, datahi, addrlo, addrhi,
                        s->code_ptr, label_ptr);
}